

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::Step(Thread *this,Ptr *out_trap)

{
  RunResult RVar1;
  Ptr func;
  RefPtr<wabt::interp::DefinedFunc> local_38;
  
  RefPtr<wabt::interp::DefinedFunc>::RefPtr
            (&local_38,this->store_,
             (Ref)(this->frames_).
                  super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].func.index);
  RVar1 = StepInternal(this,out_trap);
  if (local_38.obj_ != (DefinedFunc *)0x0) {
    Store::DeleteRoot(local_38.store_,local_38.root_index_);
  }
  return RVar1;
}

Assistant:

RunResult Thread::Step(Trap::Ptr* out_trap) {
  DefinedFunc::Ptr func{store_, frames_.back().func};
  return StepInternal(out_trap);
}